

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio.c
# Opt level: O3

void audio_callback(void *userdata,Uint8 *stream,int length)

{
  ulong uVar1;
  ulong uVar2;
  float *out;
  long lVar3;
  undefined4 uVar4;
  
  if (3 < (uint)length) {
    uVar2 = *(ulong *)((long)userdata + 0x4070);
    uVar1 = *(ulong *)((long)userdata + 0x4078);
    lVar3 = 0;
    do {
      if (uVar2 < uVar1) {
        *(ulong *)((long)userdata + 0x4070) = uVar2 + 1;
        uVar4 = *(undefined4 *)((long)userdata + (ulong)((uint)uVar2 & 0xfff) * 4 + 0x70);
        *(undefined4 *)((long)userdata + 0x408c) = uVar4;
        uVar2 = uVar2 + 1;
      }
      else {
        uVar4 = *(undefined4 *)((long)userdata + 0x408c);
      }
      *(undefined4 *)(stream + lVar3 * 4) = uVar4;
      lVar3 = lVar3 + 1;
    } while (((ulong)(long)length >> 2) + (ulong)((ulong)(long)length >> 2 == 0) != lVar3);
  }
  return;
}

Assistant:

void audio_callback(void* userdata, Uint8* stream, int length) {
    gba_apu_t* apu = (gba_apu_t*)userdata;
    float* out = (float*)stream;
    for (int i = 0; i < length / sizeof(float); i++) {
        if (apu->bigbuffer.read_index < apu->bigbuffer.write_index) {
            apu->apu_last_sample = apu->bigbuffer.buf[(apu->bigbuffer.read_index++) % AUDIO_BIGBUFFER_SIZE];
        }
        *out++ = apu->apu_last_sample;
    }
}